

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

int64_t CLI::detail::to_flag_value(string *val)

{
  char cVar1;
  __type _Var2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  char *pcVar8;
  int *piVar9;
  long lVar10;
  string *in_RDI;
  char *loc_ptr;
  int64_t ret;
  char *in_stack_ffffffffffffff38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff59;
  undefined1 in_stack_ffffffffffffff5a;
  undefined1 in_stack_ffffffffffffff5b;
  undefined4 in_stack_ffffffffffffff5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff78;
  char *local_68;
  longlong local_60;
  string local_58 [32];
  string local_38 [38];
  allocator local_12;
  allocator local_11 [17];
  
  if ((to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_),
     iVar6 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,"true",local_11
              );
    ::std::allocator<char>::~allocator((allocator<char> *)local_11);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::trueString_abi_cxx11_);
  }
  if ((to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_ == '\0') &&
     (iVar6 = __cxa_guard_acquire(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_),
     iVar6 != 0)) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,"false",
               &local_12);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_12);
    __cxa_atexit(::std::__cxx11::string::~string,
                 &to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&to_flag_value(std::__cxx11::string)::falseString_abi_cxx11_);
  }
  _Var2 = ::std::operator==(in_stack_ffffffffffffff60,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff5c,
                                     CONCAT13(in_stack_ffffffffffffff5b,
                                              CONCAT12(in_stack_ffffffffffffff5a,
                                                       CONCAT11(in_stack_ffffffffffffff59,
                                                                in_stack_ffffffffffffff58)))));
  if (_Var2) {
    return 1;
  }
  _Var2 = ::std::operator==(in_stack_ffffffffffffff60,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff5c,
                                     CONCAT13(in_stack_ffffffffffffff5b,
                                              CONCAT12(in_stack_ffffffffffffff5a,
                                                       CONCAT11(in_stack_ffffffffffffff59,
                                                                in_stack_ffffffffffffff58)))));
  if (_Var2) {
    return -1;
  }
  ::std::__cxx11::string::string(local_58,in_RDI);
  to_lower(in_stack_ffffffffffffff78);
  ::std::__cxx11::string::operator=(in_RDI,local_38);
  ::std::__cxx11::string::~string(local_38);
  ::std::__cxx11::string::~string(local_58);
  local_60 = 0;
  lVar7 = ::std::__cxx11::string::size();
  if (lVar7 == 1) {
    pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)in_RDI);
    if (('0' < *pcVar8) &&
       (pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)in_RDI), *pcVar8 < ':')) {
      pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)in_RDI);
      return (long)*pcVar8 + -0x30;
    }
    pcVar8 = (char *)::std::__cxx11::string::operator[]((ulong)in_RDI);
    cVar1 = *pcVar8;
    if (cVar1 != '+') {
      if ((((cVar1 == '-') || (cVar1 == '0')) || (cVar1 == 'f')) || (cVar1 == 'n')) {
        return -1;
      }
      if ((cVar1 != 't') && (cVar1 != 'y')) {
        piVar9 = __errno_location();
        *piVar9 = 0x16;
        return -1;
      }
    }
    return 1;
  }
  _Var2 = ::std::operator==(in_stack_ffffffffffffff60,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT44(in_stack_ffffffffffffff5c,
                                     CONCAT13(in_stack_ffffffffffffff5b,
                                              CONCAT12(in_stack_ffffffffffffff5a,
                                                       CONCAT11(in_stack_ffffffffffffff59,
                                                                in_stack_ffffffffffffff58)))));
  if ((((_Var2) ||
       (uVar3 = ::std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), (bool)uVar3)
       ) || (uVar4 = ::std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38),
            (bool)uVar4)) ||
     (bVar5 = ::std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar5)) {
    local_60 = 1;
  }
  else {
    _Var2 = ::std::operator==(in_stack_ffffffffffffff60,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT44(in_stack_ffffffffffffff5c,
                                       CONCAT13(uVar3,CONCAT12(uVar4,CONCAT11(bVar5,
                                                  in_stack_ffffffffffffff58)))));
    if (((_Var2) ||
        (bVar5 = ::std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar5)) ||
       ((bVar5 = ::std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar5 ||
        (bVar5 = ::std::operator==(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38), bVar5)))) {
      local_60 = -1;
    }
    else {
      local_68 = (char *)0x0;
      pcVar8 = (char *)::std::__cxx11::string::c_str();
      local_60 = strtoll(pcVar8,&local_68,0);
      pcVar8 = local_68;
      lVar7 = ::std::__cxx11::string::c_str();
      lVar10 = ::std::__cxx11::string::size();
      if ((pcVar8 != (char *)(lVar7 + lVar10)) && (piVar9 = __errno_location(), *piVar9 == 0)) {
        piVar9 = __errno_location();
        *piVar9 = 0x16;
      }
    }
  }
  return local_60;
}

Assistant:

inline std::int64_t to_flag_value(std::string val) noexcept {
    static const std::string trueString("true");
    static const std::string falseString("false");
    if(val == trueString) {
        return 1;
    }
    if(val == falseString) {
        return -1;
    }
    val = detail::to_lower(val);
    std::int64_t ret = 0;
    if(val.size() == 1) {
        if(val[0] >= '1' && val[0] <= '9') {
            return (static_cast<std::int64_t>(val[0]) - '0');
        }
        switch(val[0]) {
        case '0':
        case 'f':
        case 'n':
        case '-':
            ret = -1;
            break;
        case 't':
        case 'y':
        case '+':
            ret = 1;
            break;
        default:
            errno = EINVAL;
            return -1;
        }
        return ret;
    }
    if(val == trueString || val == "on" || val == "yes" || val == "enable") {
        ret = 1;
    } else if(val == falseString || val == "off" || val == "no" || val == "disable") {
        ret = -1;
    } else {
        char *loc_ptr{nullptr};
        ret = std::strtoll(val.c_str(), &loc_ptr, 0);
        if(loc_ptr != (val.c_str() + val.size()) && errno == 0) {
            errno = EINVAL;
        }
    }
    return ret;
}